

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_int8.h
# Opt level: O2

void ncnn::pack_A_tile_int8(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [32];
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  
  iVar4 = cpu_support_x86_avx512_vnni();
  if (iVar4 != 0) {
    pack_A_tile_int8_avx512vnni(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar4 = cpu_support_x86_avx_vnni_int8();
  if (iVar4 != 0) {
    pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar4 = cpu_support_x86_avx_vnni();
  if (iVar4 != 0) {
    pack_A_tile_int8_avxvnni(A,AT,i,max_ii,k,max_kk);
    return;
  }
  pauVar9 = (undefined1 (*) [32])AT->data;
  lVar5 = (long)k;
  lVar6 = (long)i;
  lVar7 = (long)max_ii;
  lVar10 = lVar6 + 1;
  uVar8 = 0;
  auVar18 = vpmovsxbd_avx512f(_DAT_00538790);
  for (; (long)(uVar8 | 0xf) < lVar7; uVar8 = uVar8 + 0x10) {
    auVar19 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar19,auVar18);
    pvVar1 = A->data;
    lVar3 = A->elemsize * lVar6 * (long)A->w + lVar5;
    for (lVar11 = 0; (int)lVar11 + 1 < max_kk; lVar11 = lVar11 + 2) {
      in_ZMM2 = vpgatherdd_avx512f(*(undefined4 *)((long)pvVar1 + lVar6 + lVar11 + lVar3));
      auVar16 = vpmovdw_avx512f(in_ZMM2);
      *pauVar9 = auVar16;
      pauVar9 = pauVar9 + 1;
    }
    for (; (int)lVar11 < max_kk; lVar11 = lVar11 + 1) {
      in_ZMM2 = vpgatherdd_avx512f(*(undefined4 *)((long)pvVar1 + lVar6 + lVar11 + lVar3));
      auVar14 = vpmovdb_avx512f(in_ZMM2);
      *(undefined1 (*) [16])*pauVar9 = auVar14;
      pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 0x10);
    }
    lVar6 = lVar6 + 0x10;
    lVar10 = lVar10 + 0x10;
  }
  auVar16 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  for (; (long)(uVar8 | 7) < lVar7; uVar8 = uVar8 + 8) {
    auVar17 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar17,auVar16);
    for (iVar4 = 0; iVar4 + 1 < max_kk; iVar4 = iVar4 + 2) {
      auVar17 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
      auVar17 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar17);
      in_ZMM2 = ZEXT3264(auVar17);
      in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
      auVar14 = vpmovdw_avx512vl(auVar17);
      *(undefined1 (*) [16])*pauVar9 = auVar14;
      pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 0x10);
    }
    for (; iVar4 < max_kk; iVar4 = iVar4 + 1) {
      auVar17 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
      auVar17 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar17);
      in_ZMM2 = ZEXT3264(auVar17);
      in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
      auVar14 = vpmovdb_avx512vl(auVar17);
      *(long *)*pauVar9 = auVar14._0_8_;
      pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 8);
    }
    lVar6 = lVar6 + 8;
    lVar10 = lVar10 + 8;
  }
  auVar14 = vpmovsxbd_avx(ZEXT416(0x3020100));
  for (; (long)(uVar8 | 3) < lVar7; uVar8 = uVar8 + 4) {
    auVar15 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar15,auVar14);
    for (iVar4 = 0; iVar4 + 1 < max_kk; iVar4 = iVar4 + 2) {
      auVar15 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar15 = vpgatherdd((undefined1  [16])0x0,auVar15);
      in_ZMM2 = ZEXT1664((undefined1  [16])0x0);
      auVar15 = vpmovdw_avx512vl(auVar15);
      *(long *)*pauVar9 = auVar15._0_8_;
      pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 8);
    }
    for (; iVar4 < max_kk; iVar4 = iVar4 + 1) {
      auVar15 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar15 = vpgatherdd((undefined1  [16])0x0,auVar15);
      in_ZMM2 = ZEXT1664((undefined1  [16])0x0);
      auVar15 = vpmovdb_avx512vl(auVar15);
      *(int *)*pauVar9 = auVar15._0_4_;
      pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 4);
    }
    lVar6 = lVar6 + 4;
    lVar10 = lVar10 + 4;
  }
  for (; (long)(uVar8 | 1) < lVar7; uVar8 = uVar8 + 2) {
    pvVar1 = A->data;
    lVar3 = A->elemsize * lVar6 * (long)A->w + lVar5;
    lVar11 = A->elemsize * lVar10 * (long)A->w + lVar5;
    pauVar12 = pauVar9;
    for (lVar13 = 0; (int)lVar13 + 1 < max_kk; lVar13 = lVar13 + 2) {
      *(undefined1 *)((long)*pauVar9 + lVar13 * 2) = *(undefined1 *)((long)pvVar1 + lVar13 + lVar3);
      *(undefined1 *)((long)*pauVar9 + lVar13 * 2 + 1) =
           *(undefined1 *)((long)pvVar1 + lVar13 + lVar3 + 1);
      *(undefined1 *)((long)*pauVar9 + lVar13 * 2 + 2) =
           *(undefined1 *)((long)pvVar1 + lVar13 + lVar11);
      *(undefined1 *)((long)*pauVar9 + lVar13 * 2 + 3) =
           *(undefined1 *)((long)pvVar1 + lVar13 + lVar11 + 1);
      pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 4);
    }
    for (; pauVar9 = pauVar12, (int)lVar13 < max_kk; lVar13 = lVar13 + 1) {
      (*pauVar9)[0] = *(undefined1 *)((long)pvVar1 + lVar13 + lVar3);
      *(undefined1 *)((long)*pauVar9 + 1) = *(undefined1 *)((long)pvVar1 + lVar13 + lVar11);
      pauVar12 = (undefined1 (*) [32])((long)*pauVar9 + 2);
    }
    lVar6 = lVar6 + 2;
    lVar10 = lVar10 + 2;
  }
  if (max_kk < 1) {
    max_kk = 0;
  }
  for (; (long)uVar8 < lVar7; uVar8 = uVar8 + 1) {
    iVar4 = A->w;
    pvVar1 = A->data;
    sVar2 = A->elemsize;
    for (lVar10 = 0; max_kk != (int)lVar10; lVar10 = lVar10 + 1) {
      *(undefined1 *)((long)*pauVar9 + lVar10) =
           *(undefined1 *)((long)pvVar1 + lVar10 + sVar2 * lVar6 * (long)iVar4 + lVar5);
    }
    pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + lVar10);
    lVar6 = lVar6 + 1;
  }
  return;
}

Assistant:

static void pack_A_tile_int8(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        pack_A_tile_int8_avx512vnni(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNIINT8 && __AVX__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni_int8())
    {
        pack_A_tile_int8_avxvnniint8(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        pack_A_tile_int8_avxvnni(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        pack_A_tile_int8_avx2(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

    // NCNN_LOGE("pack_A_tile_int8");
    // assert A.elempack == 1
    // assert A.dims == 2

    signed char* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX2__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

        __m512i _vindex = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(A.w));

        int kk = 0;
#if __AVX512VNNI__
        __m512i _w_shift = _mm512_setzero_si512();
        __m512i _v127 = _mm512_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m512i _p = _mm512_i32gather_epi32(_vindex, p0, sizeof(signed char));
            _w_shift = _mm512_dpbusd_epi32(_w_shift, _v127, _p);
            _mm512_storeu_si512((__m512i*)pp, _p);
            pp += 64;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            _mm512_storeu_si512((__m512i*)pp, _w_shift);
            pp += 64;
        }
#endif // __AVX512VNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m256i _p = _mm512_cvtepi32_epi16(_mm512_i32gather_epi32(_vindex, p0, sizeof(signed char)));
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm512_cvtepi32_epi8(_mm512_i32gather_epi32(_vindex, p0, sizeof(signed char)));
            _mm_store_si128((__m128i*)pp, _p);
            pp += 16;
            p0++;
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

        __m256i _vindex = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(A.w));

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m256i _p = _mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        __m256i _w_shift = _mm256_setzero_si256();
        __m256i _v127 = _mm256_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m256i _p = _mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _w_shift = _mm256_comp_dpbusd_epi32(_w_shift, _v127, _p);
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            _mm256_storeu_si256((__m256i*)pp, _w_shift);
            pp += 32;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m128i _p = _mm256_comp_cvtepi32_epi16(_mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
#if __AVX512F__
            _mm_store_si128((__m128i*)pp, _p);
#else
            _mm_storeu_si128((__m128i*)pp, _p);
#endif
            pp += 16;
            p0 += 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm256_comp_cvtepi32_epi8(_mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0++;
        }
    }
#endif // __AVX2__
    for (; ii + 3 < max_ii; ii += 4)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(A.w));
#else
        const signed char* p1 = A.row<const signed char>(i + ii + 1) + k;
        const signed char* p2 = A.row<const signed char>(i + ii + 2) + k;
        const signed char* p3 = A.row<const signed char>(i + ii + 3) + k;
#endif // __AVX2__

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _mm_storeu_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        __m128i _w_shift = _mm_setzero_si128();
        __m128i _v127 = _mm_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _w_shift = _mm_comp_dpbusd_epi32(_w_shift, _v127, _p);
            _mm_storeu_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            _mm_storeu_si128((__m128i*)pp, _w_shift);
            pp += 16;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
#if __AVX2__
            __m128i _p = _mm_comp_cvtepi32_epi16(_mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0 += 2;
#else
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p1[0];
            pp[3] = p1[1];
            pp[4] = p2[0];
            pp[5] = p2[1];
            pp[6] = p3[0];
            pp[7] = p3[1];
            pp += 8;
            p0 += 2;
            p1 += 2;
            p2 += 2;
            p3 += 2;
#endif // __AVX2__
        }
        for (; kk < max_kk; kk++)
        {
#if __AVX2__
            __m128i _p = _mm_comp_cvtepi32_epi8(_mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_store_ss((float*)pp, _mm_castsi128_ps(_p));
            pp += 4;
            p0++;
#else
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp[2] = p2[0];
            pp[3] = p3[0];
            pp += 4;
            p0++;
            p1++;
            p2++;
            p3++;
#endif // __AVX2__
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;
        const signed char* p1 = A.row<const signed char>(i + ii + 1) + k;

        int kk = 0;
#if __SSE2__
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp[4] = p1[0];
            pp[5] = p1[1];
            pp[6] = p1[2];
            pp[7] = p1[3];
            pp += 8;
            p0 += 4;
            p1 += 4;
        }
#else  // __AVXVNNIINT8__
        int w_shift0 = 0;
        int w_shift1 = 0;
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp[4] = p1[0];
            pp[5] = p1[1];
            pp[6] = p1[2];
            pp[7] = p1[3];
            w_shift0 += pp[0];
            w_shift0 += pp[1];
            w_shift0 += pp[2];
            w_shift0 += pp[3];
            w_shift1 += pp[4];
            w_shift1 += pp[5];
            w_shift1 += pp[6];
            w_shift1 += pp[7];
            pp += 8;
            p0 += 4;
            p1 += 4;
        }
        if (max_kk >= 4)
        {
            ((int*)pp)[0] = w_shift0 * 127;
            ((int*)pp)[1] = w_shift1 * 127;
            pp += 8;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p1[0];
            pp[3] = p1[1];
            pp += 4;
            p0 += 2;
            p1 += 2;
        }
#endif // __SSE2__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp += 2;
            p0++;
            p1++;
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp += 4;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        int w_shift = 0;
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            w_shift += pp[0];
            w_shift += pp[1];
            w_shift += pp[2];
            w_shift += pp[3];
            pp += 4;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            ((int*)pp)[0] = w_shift * 127;
            pp += 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp += 1;
            p0++;
        }
    }
}